

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O0

ModulePtr chaiscript::json_wrap::library(ModulePtr *m)

{
  element_type *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Module *in_RSI;
  element_type *in_RDI;
  ModulePtr MVar1;
  anon_class_1_0_00000001_for_m_f *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  Proxy_Function *in_stack_ffffffffffffff38;
  allocator *f;
  allocator local_91;
  string local_90 [71];
  allocator local_49;
  string local_48 [72];
  
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x359ba6);
  fun<chaiscript::json_wrap::library(std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_ffffffffffffff28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"from_json",&local_49);
  Module::add(in_RSI,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x359c30);
  name = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x359c3a);
  fun<std::__cxx11::string,chaiscript::Boxed_Value_const&>
            ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
              *)in_stack_ffffffffffffff38);
  f = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"to_json",f);
  Module::add(in_RSI,(Proxy_Function *)f,(string *)name);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x359cab);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)name,
             (shared_ptr<chaiscript::Module> *)in_stack_ffffffffffffff28);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ModulePtr library(ModulePtr m = std::make_shared<Module>())
      {

        m->add(chaiscript::fun([](const std::string &t_str) { return from_json(t_str); }), "from_json");
        m->add(chaiscript::fun(&json_wrap::to_json), "to_json");

        return m;

      }